

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

PCMSegment *
Storage::Encodings::AppleGCR::Macintosh::header
          (PCMSegment *__return_storage_ptr__,uint8_t type,uint8_t track,uint8_t sector,
          bool side_two)

{
  size_t c;
  uint8_t *source;
  long lVar1;
  value_type_conflict3 *__val;
  byte bVar2;
  
  source = (uint8_t *)operator_new(0xb);
  source[8] = '\0';
  source[9] = '\0';
  source[10] = '\0';
  source[0] = 0xd5;
  source[1] = 0xaa;
  source[2] = 0x96;
  source[3] = track & 0x3f;
  source[4] = sector;
  bVar2 = track >> 6 | side_two << 5;
  source[5] = bVar2;
  source[6] = type;
  source[7] = sector ^ type ^ track & 0x3f ^ bVar2;
  lVar1 = 3;
  do {
    source[lVar1] = (anonymous_namespace)::six_and_two_mapping[source[lVar1]];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  source[8] = 0xde;
  source[9] = 0xaa;
  source[10] = 0xeb;
  Disk::PCMSegment::PCMSegment(__return_storage_ptr__,0x58,source);
  operator_delete(source,0xb);
  return __return_storage_ptr__;
}

Assistant:

Storage::Disk::PCMSegment AppleGCR::Macintosh::header(uint8_t type, uint8_t track, uint8_t sector, bool side_two) {
	std::vector<uint8_t> data(11);

	// The standard prologue.
	data[0] = header_prologue[0];
	data[1] = header_prologue[1];
	data[2] = header_prologue[2];

	// There then follows:
	//
	//	1) the low six bits of the track number;
	//	2) the sector number;
	//	3) the high five bits of the track number plus a side flag;
	//	4) the type; and
	//	5) the XOR of all those fields.
	//
	//	(all two-and-six encoded).
	data[3] = track&0x3f;
	data[4] = sector;
	data[5] = (side_two ? 0x20 : 0x00) | ((track >> 6) & 0x1f);
	data[6] = type;
	data[7] = data[3] ^ data[4] ^ data[5] ^ data[6];

	for(size_t c = 3; c < 8; ++c) {
		data[c] = six_and_two_mapping[data[c]];
	}

	// Then the standard epilogue.
	data[8] = epilogue[0];
	data[9] = epilogue[1];
	data[10] = epilogue[2];

	return Storage::Disk::PCMSegment(data);
}